

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Slider.cxx
# Opt level: O0

int __thiscall Fl_Value_Slider::handle(Fl_Value_Slider *this,int event)

{
  int iVar1;
  Fl_Boxtype FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 local_24;
  undefined4 local_20;
  int shh;
  int sww;
  int syy;
  int sxx;
  int event_local;
  Fl_Value_Slider *this_local;
  
  if (event == 1) {
    iVar1 = Fl::visible_focus();
    if (iVar1 != 0) {
      Fl::focus((Fl_Widget *)this);
      Fl_Widget::redraw((Fl_Widget *)this);
    }
  }
  sww = Fl_Widget::x((Fl_Widget *)this);
  shh = Fl_Widget::y((Fl_Widget *)this);
  local_20 = Fl_Widget::w((Fl_Widget *)this);
  local_24 = Fl_Widget::h((Fl_Widget *)this);
  iVar1 = Fl_Valuator::horizontal((Fl_Valuator *)this);
  if (iVar1 == 0) {
    shh = shh + 0x19;
    local_24 = local_24 + -0x19;
  }
  else {
    sww = sww + 0x23;
    local_20 = local_20 + -0x23;
  }
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar1 = Fl::box_dx(FVar2);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar3 = Fl::box_dy(FVar2);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dw(FVar2);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar5 = Fl::box_dh(FVar2);
  iVar1 = Fl_Slider::handle(&this->super_Fl_Slider,event,sww + iVar1,shh + iVar3,local_20 - iVar4,
                            local_24 - iVar5);
  return iVar1;
}

Assistant:

int Fl_Value_Slider::handle(int event) {
  if (event == FL_PUSH && Fl::visible_focus()) {
    Fl::focus(this);
    redraw();
  }
  int sxx = x(), syy = y(), sww = w(), shh = h();
  if (horizontal()) {
    sxx += 35; sww -= 35;
  } else {
    syy += 25; shh -= 25;
  }
  return Fl_Slider::handle(event,
			   sxx+Fl::box_dx(box()),
			   syy+Fl::box_dy(box()),
			   sww-Fl::box_dw(box()),
			   shh-Fl::box_dh(box()));
}